

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O3

void __thiscall
mocker::ir::FunctionModule::FunctionModule(FunctionModule *this,FunctionModule *param_1)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_false>_>_>
  local_38;
  
  (this->identifier)._M_dataplus._M_p = (pointer)&(this->identifier).field_2;
  pcVar1 = (param_1->identifier)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->identifier)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->args,&param_1->args);
  std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::list
            (&this->bbs,&param_1->bbs);
  this->isExternal = param_1->isExternal;
  sVar2 = param_1->tempRegCounter;
  this->bbsSz = param_1->bbsSz;
  this->tempRegCounter = sVar2;
  local_38._M_h = (__hashtable_alloc *)&this->bbMap;
  (this->bbMap)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->bbMap)._M_h._M_bucket_count = (param_1->bbMap)._M_h._M_bucket_count;
  (this->bbMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bbMap)._M_h._M_element_count = (param_1->bbMap)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(param_1->bbMap)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (param_1->bbMap)._M_h._M_rehash_policy._M_next_resize;
  (this->bbMap)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->bbMap)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->bbMap)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->bbMap)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->bbMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>,false>>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>,std::allocator<std::pair<unsigned_long_const,std::reference_wrapper<mocker::ir::BasicBlock>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_38._M_h,&(param_1->bbMap)._M_h,&local_38);
  local_38._M_h = (__hashtable_alloc *)&this->predecessors;
  (this->predecessors)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->predecessors)._M_h._M_bucket_count = (param_1->predecessors)._M_h._M_bucket_count;
  (this->predecessors)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->predecessors)._M_h._M_element_count = (param_1->predecessors)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(param_1->predecessors)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (param_1->predecessors)._M_h._M_rehash_policy._M_next_resize;
  (this->predecessors)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->predecessors)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->predecessors)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->predecessors)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->predecessors)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,false>>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<unsigned_long_const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_38._M_h,&(param_1->predecessors)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>_>_>
              *)&local_38);
  return;
}

Assistant:

FunctionModule(const FunctionModule &) = default;